

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O2

int amqp_encode_field_value(amqp_bytes_t encoded,amqp_field_value_t *entry,size_t *offset)

{
  ulong uVar1;
  uint8_t uVar2;
  int8_t iVar3;
  ushort uVar4;
  ulong uVar5;
  uint64_t uVar6;
  size_t __n;
  void *__src;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  
  pvVar11 = encoded.bytes;
  uVar12 = encoded.len;
  uVar2 = entry->kind;
  sVar9 = *offset;
  uVar1 = sVar9 + 1;
  *offset = uVar1;
  if (uVar12 < uVar1) {
    return -2;
  }
  *(uint8_t *)((long)pvVar11 + sVar9) = uVar2;
  uVar2 = entry->kind;
  iVar7 = -10;
  switch(uVar2) {
  case 'A':
    sVar9 = *offset;
    *offset = sVar9 + 4;
    lVar13 = -1;
    lVar10 = 0;
    while (lVar13 = lVar13 + 1, lVar13 < (entry->value).boolean) {
      iVar7 = amqp_encode_field_value
                        (encoded,(amqp_field_value_t *)(lVar10 + (long)(entry->value).bytes.bytes),
                         offset);
      lVar10 = lVar10 + 0x18;
      if (iVar7 < 0) {
        return iVar7;
      }
    }
    if (uVar12 < sVar9 + 4) {
      return -0xb;
    }
    uVar8 = ((int)*offset - (int)sVar9) - 4;
    goto LAB_00109c89;
  case 'B':
switchD_00109c15_caseD_62:
    iVar3 = (entry->value).i8;
    sVar9 = *offset;
    uVar1 = sVar9 + 1;
    *offset = uVar1;
    if (uVar12 < uVar1) {
      return -0xb;
    }
    *(int8_t *)((long)pvVar11 + sVar9) = iVar3;
    break;
  case 'C':
  case 'E':
  case 'G':
  case 'H':
  case 'J':
  case 'K':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'U':
    goto switchD_00109c15_caseD_63;
  case 'D':
    iVar3 = (entry->value).i8;
    sVar9 = *offset;
    uVar1 = sVar9 + 1;
    *offset = uVar1;
    if (uVar12 < uVar1) {
      return -0xb;
    }
    *(int8_t *)((long)pvVar11 + sVar9) = iVar3;
    uVar8 = (entry->value).decimal.value;
    sVar9 = *offset;
    uVar1 = sVar9 + 4;
    *offset = uVar1;
    if (uVar12 < uVar1) {
      return -0xb;
    }
    *(uint *)((long)pvVar11 + sVar9) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    break;
  case 'F':
    iVar7 = amqp_encode_table(encoded,&(entry->value).table,offset);
    return iVar7;
  case 'I':
switchD_00109c15_caseD_66:
    uVar8 = (entry->value).u32;
    sVar9 = *offset;
    *offset = sVar9 + 4;
    if (uVar12 < sVar9 + 4) {
      return -0xb;
    }
LAB_00109c89:
    *(uint *)((long)pvVar11 + sVar9) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    break;
  case 'L':
  case 'T':
switchD_00109c15_caseD_64:
    uVar5 = (entry->value).u64;
    sVar9 = *offset;
    uVar1 = sVar9 + 8;
    *offset = uVar1;
    if (uVar12 < uVar1) {
      return -0xb;
    }
    *(ulong *)((long)pvVar11 + sVar9) =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    break;
  case 'S':
switchD_00109c4b_caseD_53:
    uVar6 = (entry->value).u64;
    sVar9 = *offset;
    uVar1 = sVar9 + 4;
    *offset = uVar1;
    if (uVar12 < uVar1) {
      return -0xb;
    }
    uVar8 = (uint)uVar6;
    *(uint *)((long)pvVar11 + sVar9) =
         uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    __n = (entry->value).u64;
    if (__n != 0) {
      __src = (entry->value).bytes.bytes;
      sVar9 = *offset;
      uVar1 = sVar9 + __n;
      *offset = uVar1;
      if (uVar12 < uVar1) {
        return -0xb;
      }
      memcpy((void *)((long)pvVar11 + sVar9),__src,__n);
    }
    break;
  case 'V':
    break;
  default:
    switch(uVar2) {
    case 'b':
      goto switchD_00109c15_caseD_62;
    case 'c':
    case 'e':
    case 'g':
    case 'h':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
      goto switchD_00109c15_caseD_63;
    case 'd':
    case 'l':
      goto switchD_00109c15_caseD_64;
    case 'f':
    case 'i':
      goto switchD_00109c15_caseD_66;
    case 's':
    case 'u':
      uVar4 = (entry->value).u16;
      sVar9 = *offset;
      uVar1 = sVar9 + 2;
      *offset = uVar1;
      if (uVar12 < uVar1) {
        return -0xb;
      }
      *(ushort *)((long)pvVar11 + sVar9) = uVar4 << 8 | uVar4 >> 8;
      break;
    case 't':
      iVar7 = (entry->value).boolean;
      sVar9 = *offset;
      uVar1 = sVar9 + 1;
      *offset = uVar1;
      if (uVar12 < uVar1) {
        return -0xb;
      }
      *(bool *)((long)pvVar11 + sVar9) = iVar7 != 0;
      break;
    default:
      if (uVar2 != 'x') {
        return -10;
      }
      goto switchD_00109c4b_caseD_53;
    }
  }
  iVar7 = 0;
switchD_00109c15_caseD_63:
  return iVar7;
}

Assistant:

static int amqp_encode_field_value(amqp_bytes_t encoded,
                                   amqp_field_value_t *entry, size_t *offset) {
  int res = AMQP_STATUS_BAD_AMQP_DATA;

  if (!amqp_encode_8(encoded, offset, entry->kind)) {
    goto out;
  }

#define FIELD_ENCODER(bits, val)                   \
  if (!amqp_encode_##bits(encoded, offset, val)) { \
    res = AMQP_STATUS_TABLE_TOO_BIG;               \
    goto out;                                      \
  }                                                \
  break

  switch (entry->kind) {
    case AMQP_FIELD_KIND_BOOLEAN:
      FIELD_ENCODER(8, entry->value.boolean ? 1 : 0);

    case AMQP_FIELD_KIND_I8:
      FIELD_ENCODER(8, entry->value.i8);
    case AMQP_FIELD_KIND_U8:
      FIELD_ENCODER(8, entry->value.u8);

    case AMQP_FIELD_KIND_I16:
      FIELD_ENCODER(16, entry->value.i16);
    case AMQP_FIELD_KIND_U16:
      FIELD_ENCODER(16, entry->value.u16);

    case AMQP_FIELD_KIND_I32:
      FIELD_ENCODER(32, entry->value.i32);
    case AMQP_FIELD_KIND_U32:
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_I64:
      FIELD_ENCODER(64, entry->value.i64);
    case AMQP_FIELD_KIND_U64:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_F32:
      /* by punning, u32 magically gets the right value...! */
      FIELD_ENCODER(32, entry->value.u32);

    case AMQP_FIELD_KIND_F64:
      /* by punning, u64 magically gets the right value...! */
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_DECIMAL:
      if (!amqp_encode_8(encoded, offset, entry->value.decimal.decimals) ||
          !amqp_encode_32(encoded, offset, entry->value.decimal.value)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_UTF8:
    /* AMQP_FIELD_KIND_UTF8 and AMQP_FIELD_KIND_BYTES have the
       same implementation, but different interpretations. */
    /* fall through */
    case AMQP_FIELD_KIND_BYTES:
      if (!amqp_encode_32(encoded, offset, (uint32_t)entry->value.bytes.len) ||
          !amqp_encode_bytes(encoded, offset, entry->value.bytes)) {
        res = AMQP_STATUS_TABLE_TOO_BIG;
        goto out;
      }
      break;

    case AMQP_FIELD_KIND_ARRAY:
      res = amqp_encode_array(encoded, &entry->value.array, offset);
      goto out;

    case AMQP_FIELD_KIND_TIMESTAMP:
      FIELD_ENCODER(64, entry->value.u64);

    case AMQP_FIELD_KIND_TABLE:
      res = amqp_encode_table(encoded, &entry->value.table, offset);
      goto out;

    case AMQP_FIELD_KIND_VOID:
      break;

    default:
      res = AMQP_STATUS_INVALID_PARAMETER;
      goto out;
  }

  res = AMQP_STATUS_OK;

out:
  return res;
}